

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uint uVar2;
  uv__queue *puVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  __pid_t __pid;
  uv_process_t *puVar6;
  uv_loop_t *puVar7;
  int iVar8;
  __pid_t _Var9;
  int iVar10;
  int (*pipes) [2];
  long *plVar11;
  int *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int (*fds) [2];
  ulong uVar16;
  long lVar17;
  pid_t pid;
  int exec_errorno;
  int status;
  int pipes_storage [8] [2];
  __pid_t local_a4;
  int local_a0;
  uint local_9c;
  uv__queue *local_98;
  uv_process_t *local_90;
  uv_loop_t *local_88;
  int local_80;
  int local_7c;
  int local_78 [18];
  
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  (process->handle_queue).next = &loop->handle_queue;
  puVar3 = (loop->handle_queue).prev;
  (process->handle_queue).prev = puVar3;
  puVar3->next = &process->handle_queue;
  (loop->handle_queue).prev = &process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  puVar3 = &process->queue;
  (process->queue).next = puVar3;
  (process->queue).prev = puVar3;
  process->status = 0;
  process->pid = 0;
  if ((options->cpumask != (char *)0x0) &&
     (uVar15 = options->cpumask_size, iVar8 = uv_cpumask_size(), uVar15 < (ulong)(long)iVar8)) {
    return -0x16;
  }
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                  ,0x4b1,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0xff < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                  ,0x4b9,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  uVar2 = options->stdio_count;
  uVar13 = 3;
  if (3 < (int)uVar2) {
    uVar13 = uVar2;
  }
  uVar15 = (ulong)uVar13;
  local_98 = puVar3;
  local_88 = loop;
  if ((int)uVar2 < 9) {
    pipes = (int (*) [2])local_78;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar15 * 8);
    if (pipes == (int (*) [2])0x0) {
      return -0xc;
    }
  }
  local_9c = uVar13;
  local_90 = process;
  memset(pipes,0xff,uVar15 * 8);
  if (0 < options->stdio_count) {
    lVar14 = 8;
    lVar17 = 0;
    fds = pipes;
    do {
      puVar4 = options->stdio;
      uVar2 = *(uint *)((long)puVar4 + lVar14 + -8);
      switch(uVar2 & 7) {
      case 0:
        break;
      case 1:
        lVar5 = *(long *)((long)&puVar4->flags + lVar14);
        if (lVar5 == 0) {
          __assert_fail("container->data.stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                        ,0xd5,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (*(int *)(lVar5 + 0x10) != 7) {
LAB_001151c1:
          iVar8 = -0x16;
          goto LAB_00115206;
        }
        iVar8 = uv_socketpair(1,0,*fds,0,0);
        if (iVar8 != 0) goto LAB_00115206;
        break;
      case 2:
      case 4:
        plVar11 = (long *)((long)&puVar4->flags + lVar14);
        if ((uVar2 & 2) == 0) {
          plVar11 = (long *)(*plVar11 + 0x98);
        }
        if ((int)*plVar11 == -1) goto LAB_001151c1;
        (*fds)[1] = (int)*plVar11;
        break;
      default:
        __assert_fail("0 && \"Unexpected flags\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                      ,0xe9,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      lVar17 = lVar17 + 1;
      fds = fds + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar17 < options->stdio_count);
  }
  puVar7 = local_88;
  uv_signal_start(&local_88->child_watcher,uv__chld,0x11);
  uv_rwlock_wrlock(&puVar7->cloexec_lock);
  pthread_setcancelstate(1,&local_80);
  local_a0 = 0;
  iVar8 = uv__spawn_and_init_child_fork(options,&local_a0,local_9c,pipes,&local_a4);
  pthread_setcancelstate(local_80,(int *)0x0);
  uv_rwlock_wrunlock(&puVar7->cloexec_lock);
  puVar6 = local_90;
  __pid = local_a4;
  if (iVar8 == 0) {
    if (local_a0 != 0) {
      do {
        _Var9 = waitpid(__pid,&local_7c,0);
        if (_Var9 != -1) break;
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
      iVar8 = local_a0;
      if (_Var9 != __pid) {
        __assert_fail("err == *pid",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                      ,0x449,
                      "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                     );
      }
      goto LAB_001150dc;
    }
LAB_001150e0:
    puVar6->pid = local_a4;
    puVar6->exit_cb = options->exit_cb;
    (puVar6->queue).next = &puVar7->process_handles;
    puVar3 = (puVar7->process_handles).prev;
    (puVar6->queue).prev = puVar3;
    puVar3->next = local_98;
    (puVar7->process_handles).prev = local_98;
    uVar2 = puVar6->flags;
    iVar8 = 0;
    if (((uVar2 & 4) == 0) && (puVar6->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
      puVar1 = &puVar6->loop->active_handles;
      *puVar1 = *puVar1 + 1;
      iVar8 = 0;
    }
  }
  else {
LAB_001150dc:
    if (iVar8 == 0) goto LAB_001150e0;
  }
  iVar10 = options->stdio_count;
  if (0 < iVar10) {
    lVar17 = 0;
    lVar14 = 0;
    do {
      puVar4 = options->stdio;
      if (((*(byte *)((long)&puVar4->flags + lVar17) & 1) != 0) && (-1 < pipes[lVar14][0])) {
        iVar10 = uv__close(pipes[lVar14][1]);
        if (iVar10 != 0) {
          abort();
        }
        pipes[lVar14][1] = -1;
        uv__nonblock_ioctl(pipes[lVar14][0],1);
        uVar2 = *(uint *)((long)&puVar4->flags + lVar17);
        iVar10 = uv__stream_open(*(uv_stream_t **)((long)&puVar4->data + lVar17),pipes[lVar14][0],
                                 (uVar2 & 0x10) << 0xb | (uVar2 & 0x20) << 9);
        if (iVar10 != 0) goto joined_r0x001151d3;
        iVar10 = options->stdio_count;
      }
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar14 < iVar10);
  }
LAB_00115249:
  if (pipes != (int (*) [2])local_78) {
    uv__free(pipes);
  }
  return iVar8;
joined_r0x001151d3:
  for (; iVar8 = iVar10, lVar17 != 0; lVar17 = lVar17 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar17) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar17 + -8));
    }
  }
LAB_00115206:
  uVar16 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar16) ||
       ((options->stdio[uVar16].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar16][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar16][0]);
      }
      if (pipes[uVar16][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar16][1]);
      }
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != uVar15);
  goto LAB_00115249;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  uv__queue_init(&process->queue);
  process->status = 0;
  process->pid = 0;
  return UV_ENOSYS;
#else
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  pid_t pid;
  int exec_errorno;
  int err;
  int i;

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  uv__queue_init(&process->queue);
  process->status = 0;
  process->pid = 0;

  if (options->cpumask != NULL) {
#if defined(__linux__) || defined(__FreeBSD__)
    if (options->cpumask_size < (size_t)uv_cpumask_size())
      return UV_EINVAL;
#else
    return UV_ENOTSUP;
#endif
  }

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

#ifdef UV_USE_SIGCHLD
  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);
#endif

  /* Spawn the child */
  exec_errorno = uv__spawn_and_init_child(loop, options, stdio_count, pipes, &pid);

#if 0
  /* This runs into a nodejs issue (it expects initialized streams, even if the
   * exec failed).
   * See https://github.com/libuv/libuv/pull/3107#issuecomment-782482608 */
  if (exec_errorno != 0)
      goto error;
#endif

  /* Activate this handle if exec() happened successfully, even if we later
   * fail to open a stdio handle. This ensures we can eventually reap the child
   * with waitpid. */
  if (exec_errorno == 0) {
#ifndef UV_USE_SIGCHLD
    struct kevent event;
    EV_SET(&event, pid, EVFILT_PROC, EV_ADD | EV_ONESHOT, NOTE_EXIT, 0, 0);
    if (kevent(loop->backend_fd, &event, 1, NULL, 0, NULL)) {
      if (errno != ESRCH)
        abort();
      /* Process already exited. Call waitpid on the next loop iteration. */
      process->flags |= UV_HANDLE_REAP;
      loop->flags |= UV_LOOP_REAP_CHILDREN;
    }
    /* This prevents uv__io_poll() from bailing out prematurely, being unaware
     * that we added an event here for it to react to. We will decrement this
     * again after the waitpid call succeeds. */
    loop->nfds++;
#endif

    process->pid = pid;
    process->exit_cb = options->exit_cb;
    uv__queue_insert_tail(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}